

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O2

bool __thiscall
absl::str_format_internal::FormatArgImpl::Dispatch<bool>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  IntegralConvertResult IVar1;
  FormatSinkImpl *sink;
  FormatConversionSpecImpl conv;
  
  sink = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),spec.precision_);
  if (((ulong)arg.ptr & 0xff) == 0x13) {
    *(uint *)&(sink->raw_).sink_ = (uint)this & 1;
    IVar1.value = true;
  }
  else if ((2L << (arg.buf[0] & 0x3f) & 0x9fffaU) == 0) {
    IVar1.value = false;
  }
  else {
    conv.precision_ = spec._0_4_;
    conv._0_8_ = arg.ptr;
    IVar1 = FormatConvertImpl<bool,_0>((bool)((byte)this & 1),conv,sink);
  }
  return (bool)(IVar1.value & 1);
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }